

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O0

void __thiscall UUID_BadHex_Test::TestBody(UUID_BadHex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_420;
  AssertHelper local_400;
  Message local_3f8;
  allocator local_3e9;
  string local_3e8;
  maybe<pstore::uuid,_void> local_3c2;
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_380;
  Message local_378;
  allocator local_369;
  string local_368;
  maybe<pstore::uuid,_void> local_342;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_300;
  Message local_2f8;
  allocator local_2e9;
  string local_2e8;
  maybe<pstore::uuid,_void> local_2c2;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_280;
  Message local_278;
  allocator local_269;
  string local_268;
  maybe<pstore::uuid,_void> local_242;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_200;
  Message local_1f8;
  allocator local_1e9;
  string local_1e8;
  maybe<pstore::uuid,_void> local_1c2;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_180;
  Message local_178;
  allocator local_169;
  string local_168;
  maybe<pstore::uuid,_void> local_142;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_100;
  Message local_f8;
  allocator local_e9;
  string local_e8;
  maybe<pstore::uuid,_void> local_c2;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78 [3];
  allocator local_59;
  string local_58;
  maybe<pstore::uuid,_void> local_32;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  UUID_BadHex_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"/0000000-0000-0000-0000-000000000000",&local_59)
  ;
  pstore::uuid::from_string(&local_32,&local_58);
  local_21 = pstore::maybe<pstore::uuid,_void>::has_value(&local_32);
  local_21 = !local_21;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_32);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)
               "pstore::uuid::from_string (\"/0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,":0000000-0000-0000-0000-000000000000",&local_e9)
  ;
  pstore::uuid::from_string(&local_c2,&local_e8);
  local_b1 = pstore::maybe<pstore::uuid,_void>::has_value(&local_c2);
  local_b1 = !local_b1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_c2);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b0,
               (AssertionResult *)
               "pstore::uuid::from_string (\":0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"@0000000-0000-0000-0000-000000000000",&local_169);
  pstore::uuid::from_string(&local_142,&local_168);
  local_131 = pstore::maybe<pstore::uuid,_void>::has_value(&local_142);
  local_131 = !local_131;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_142);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_130,
               (AssertionResult *)
               "pstore::uuid::from_string (\"@0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,"G0000000-0000-0000-0000-000000000000",&local_1e9);
  pstore::uuid::from_string(&local_1c2,&local_1e8);
  local_1b1 = pstore::maybe<pstore::uuid,_void>::has_value(&local_1c2);
  local_1b1 = !local_1b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_1c2);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1b0,
               (AssertionResult *)
               "pstore::uuid::from_string (\"G0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"0G000000-0000-0000-0000-000000000000",&local_269);
  pstore::uuid::from_string(&local_242,&local_268);
  local_231 = pstore::maybe<pstore::uuid,_void>::has_value(&local_242);
  local_231 = !local_231;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_242);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_230,
               (AssertionResult *)
               "pstore::uuid::from_string (\"0G000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2e8,"g0000000-0000-0000-0000-000000000000",&local_2e9);
  pstore::uuid::from_string(&local_2c2,&local_2e8);
  local_2b1 = pstore::maybe<pstore::uuid,_void>::has_value(&local_2c2);
  local_2b1 = !local_2b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_2c2);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_2b0,
               (AssertionResult *)
               "pstore::uuid::from_string (\"g0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_368,"0g000000-0000-0000-0000-000000000000",&local_369);
  pstore::uuid::from_string(&local_342,&local_368);
  local_331 = pstore::maybe<pstore::uuid,_void>::has_value(&local_342);
  local_331 = !local_331;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_342);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_330,
               (AssertionResult *)
               "pstore::uuid::from_string (\"0g000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3e8,"`0000000-0000-0000-0000-000000000000",&local_3e9);
  pstore::uuid::from_string(&local_3c2,&local_3e8);
  local_3b1 = pstore::maybe<pstore::uuid,_void>::has_value(&local_3c2);
  local_3b1 = !local_3b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
  pstore::maybe<pstore::uuid,_void>::~maybe(&local_3c2);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,(internal *)local_3b0,
               (AssertionResult *)
               "pstore::uuid::from_string (\"`0000000-0000-0000-0000-000000000000\").has_value ()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  return;
}

Assistant:

TEST (UUID, BadHex) {
    // '/' is one behind '0' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("/0000000-0000-0000-0000-000000000000").has_value ());
    // ':' is one past '9' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string (":0000000-0000-0000-0000-000000000000").has_value ());
    // '@' is one behind 'A' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("@0000000-0000-0000-0000-000000000000").has_value ());
    // 'G' is one past 'F'. Too obvious?
    EXPECT_FALSE (pstore::uuid::from_string ("G0000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("0G000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("g0000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("0g000000-0000-0000-0000-000000000000").has_value ());
    // '`' is one behind 'a' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("`0000000-0000-0000-0000-000000000000").has_value ());
}